

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH3_state_t * VELOCYPACK_XXH3_createState(void)

{
  size_t unaff_retaddr;
  XXH3_state_t *state;
  XXH3_state_t *local_8;
  
  local_8 = (XXH3_state_t *)XXH_alignedMalloc((size_t)state,unaff_retaddr);
  if (local_8 == (XXH3_state_t *)0x0) {
    local_8 = (XXH3_state_t *)0x0;
  }
  else {
    local_8->seed = 0;
  }
  return local_8;
}

Assistant:

XXH_PUBLIC_API XXH3_state_t* XXH3_createState(void) {
  XXH3_state_t* const state =
      (XXH3_state_t*)XXH_alignedMalloc(sizeof(XXH3_state_t), 64);
  if (state == NULL) return NULL;
  XXH3_INITSTATE(state);
  return state;
}